

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta)

{
  float fVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined8 uVar2;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  _Var3;
  bool bVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  undefined8 extraout_RAX;
  long lVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  uint uVar8;
  type it;
  rc_data *__last;
  rc_data *ret;
  rc_data *__first;
  long lVar9;
  long lVar10;
  int row;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 in_register_00001304 [12];
  undefined1 local_88 [16];
  _Head_base<0UL,_int_*,_false> local_78;
  float local_6c;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  unique_ptr<int[],_std::default_delete<int[]>_> local_60;
  _Head_base<0UL,_int_*,_false> local_58;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_48;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_40;
  long local_38;
  
  if ((first->current)._M_current != (last->current)._M_current) {
    local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
    fVar17 = kappa / (1.0 - kappa);
    local_6c = theta;
    local_48 = first;
    local_40._M_head_impl = (row_value *)last;
    do {
      iVar11 = (local_48->current)._M_current[-1];
      if (*(int *)(this + 0x80) <= iVar11) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
LAB_0014feae:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      row = (int)local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_68._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )(long)iVar11;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,row);
      if (local_88._8_8_ != local_88._0_8_) {
        lVar15 = *(long *)(this + 0x68);
        _Var7._M_head_impl = (int *)local_88._8_8_;
        do {
          *(float *)(lVar15 + (long)*_Var7._M_head_impl * 4) =
               local_6c * *(float *)(lVar15 + (long)*_Var7._M_head_impl * 4);
          _Var7._M_head_impl = _Var7._M_head_impl + 8;
        } while (_Var7._M_head_impl != (int *)local_88._0_8_);
      }
      if (local_88._8_8_ == local_88._0_8_) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        _Var7._M_head_impl = (int *)local_88._8_8_;
        do {
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_60,row);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_58._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_60._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            auVar19 = ZEXT864(0);
          }
          else {
            auVar19 = ZEXT864(0);
            do {
              auVar20._0_4_ =
                   (float)*(int *)(*(long *)(this + 0x48) + (long)*local_58._M_head_impl * 4);
              auVar20._4_12_ = in_register_00001304;
              auVar20 = vfmadd231ss_fma(auVar19._0_16_,auVar20,
                                        ZEXT416(*(uint *)(*(long *)(this + 0x68) +
                                                         (long)*local_58._M_head_impl * 4)));
              auVar19 = ZEXT1664(auVar20);
              local_58._M_head_impl = local_58._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_58._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_60._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
          }
          lVar15 = *(long *)(this + 0x50);
          *(int *)(lVar15 + 4 + uVar14 * 0xc) = (int)uVar14;
          *(undefined4 *)(lVar15 + 8 + uVar14 * 0xc) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*_Var7._M_head_impl * 4);
          *(float *)(lVar15 + uVar14 * 0xc) =
               *(float *)(*(long *)(*(long *)(this + 0x70) + 8) +
                         (long)*(int *)(local_88._8_8_ + 4) * 4) - auVar19._0_4_;
          _Var7._M_head_impl = _Var7._M_head_impl + 2;
          uVar14 = uVar14 + 1;
        } while (_Var7._M_head_impl != (int *)local_88._0_8_);
      }
      uVar13 = (uint)uVar14;
      uVar14 = uVar14 & 0xffffffff;
      if (1 < uVar13) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar14,(int)LZCOUNT(uVar14) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar14);
        __last = __first + 1;
        lVar15 = uVar14 * 0xc + -0xc;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar15 = lVar15 + -0xc;
        } while (lVar15 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           local_68._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) +
                  (long)local_68._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl * 0xc) < 1) {
        iVar11 = 0;
        uVar14 = 0xffffffff;
      }
      else {
        local_38 = (long)(int)uVar13 + -2;
        lVar15 = 0;
        iVar11 = 0;
        uVar12 = 0xffffffffffffffff;
        do {
          uVar2 = local_88._8_8_;
          uVar14 = uVar12 + 1;
          iVar11 = iVar11 + *(int *)(*(long *)(this + 0x50) + 8 + lVar15);
          local_78._M_head_impl._0_4_ =
               *(undefined4 *)
                (*(long *)(this + 0x58) +
                (long)_Var3._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl * 0xc);
          lVar9 = (long)*(int *)(*(long *)(this + 0x50) + 4 + lVar15);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_88._8_8_ + (lVar9 * 2 + 1) * 4));
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + lVar15) * 0.5
                                                  )),ZEXT416((uint)fVar17),ZEXT416((uint)delta));
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar9 * 2 * 4) * 4) =
               auVar20._0_4_ +
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar9 * 2 * 4) * 4);
          if ((int)local_78._M_head_impl <= iVar11) break;
          lVar15 = lVar15 + 0xc;
          bVar4 = (long)uVar12 < local_38;
          uVar12 = uVar14;
        } while (bVar4);
      }
      uVar8 = (uint)uVar14;
      if (iVar11 < *(int *)(*(long *)(this + 0x58) +
                           (long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl * 0xc)) {
        bVar4 = false;
      }
      else {
        bVar4 = iVar11 <= *(int *)(*(long *)(this + 0x58) +
                                   (long)_Var3._M_t.
                                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                         .
                                         super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                         ._M_head_impl * 0xc + 4);
      }
      if (((int)(uVar8 + 1) < (int)uVar13) && (bVar4)) {
        local_78._M_head_impl = (int *)(long)(int)uVar13;
        lVar15 = (long)(int)uVar8 * 0xc;
        lVar9 = (long)(int)uVar8 + 2;
        do {
          uVar2 = local_88._8_8_;
          lVar6 = *(long *)(this + 0x50);
          iVar11 = iVar11 + *(int *)(lVar6 + 0x14 + lVar15);
          if (iVar11 < *(int *)(*(long *)(this + 0x58) +
                               (long)_Var3._M_t.
                                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                     .
                                     super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                     ._M_head_impl * 0xc)) {
            bVar4 = false;
          }
          else {
            bVar4 = iVar11 <= *(int *)(*(long *)(this + 0x58) +
                                       (long)_Var3._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                             ._M_head_impl * 0xc + 4);
          }
          lVar10 = (long)*(int *)(lVar6 + 0x10 + lVar15);
          if (bVar4) {
            fVar1 = *(float *)(lVar6 + 0xc + lVar15);
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              bVar4 = fVar1 == 0.0;
              bVar16 = 0.0 < fVar1;
            }
            else {
              dVar18 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar4 = dVar18 == 0.5;
              bVar16 = 0.5 < dVar18;
            }
            bVar4 = !bVar16 && !bVar4;
          }
          if (bVar4) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar2 + (lVar10 * 2 + 1) * 4));
            lVar6 = *(long *)(this + 0x68);
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar15) * 0.5)),ZEXT416((uint)fVar17)
                                      ,ZEXT416((uint)delta));
            lVar10 = (long)*(int *)(uVar2 + lVar10 * 2 * 4);
            fVar1 = auVar20._0_4_ + *(float *)(lVar6 + lVar10 * 4);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar2 + (lVar10 * 2 + 1) * 4));
            lVar6 = *(long *)(this + 0x68);
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar15) * 0.5)),ZEXT416((uint)fVar17)
                                      ,ZEXT416((uint)delta));
            lVar10 = (long)*(int *)(uVar2 + lVar10 * 2 * 4);
            fVar1 = *(float *)(lVar6 + lVar10 * 4) - auVar20._0_4_;
          }
          *(float *)(lVar6 + lVar10 * 4) = fVar1;
          bVar16 = lVar9 < (long)local_78._M_head_impl;
          uVar8 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar8;
          lVar15 = lVar15 + 0xc;
          lVar9 = lVar9 + 1;
        } while ((bool)(bVar16 & bVar4));
      }
      if ((int)(uVar8 + 1) < (int)uVar13) {
        lVar15 = (long)(int)uVar8 * 0xc;
        iVar11 = ~uVar8 + uVar13;
        do {
          uVar2 = local_88._8_8_;
          lVar9 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar15);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_88._8_8_ + (lVar9 * 2 + 1) * 4));
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar15)
                                                  * 0.5)),ZEXT416((uint)fVar17),ZEXT416((uint)delta)
                                   );
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar9 * 2 * 4) * 4) =
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar2 + lVar9 * 2 * 4) * 4) -
               auVar20._0_4_;
          lVar15 = lVar15 + 0xc;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      bVar4 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>_>
                          *)this,(int)local_68._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl,x);
      if (!bVar4) goto LAB_0014feae;
      _Var5._M_current = (local_48->current)._M_current + -1;
      (local_48->current)._M_current = _Var5._M_current;
    } while (_Var5._M_current != *(int **)local_40._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }